

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huf_decompress.c
# Opt level: O2

size_t HUF_decompress4X2_usingDTable_internal
                 (void *dst,size_t dstSize,void *cSrc,size_t cSrcSize,HUF_DTable *DTable,int bmi2)

{
  undefined2 *puVar1;
  undefined2 *puVar2;
  undefined2 *puVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  undefined2 uVar7;
  size_t sVar8;
  byte bVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  BIT_DStream_status BVar13;
  BIT_DStream_status BVar14;
  BIT_DStream_status BVar15;
  BIT_DStream_status BVar16;
  ulong uVar17;
  int iVar18;
  uint uVar19;
  ulong uVar20;
  uint uVar21;
  uint uVar22;
  int iVar23;
  int iVar24;
  int iVar25;
  ulong uVar26;
  undefined2 *puVar27;
  ulong uVar28;
  undefined2 *puVar29;
  uint uVar30;
  ulong uVar31;
  ulong uVar32;
  undefined2 *puVar33;
  void *pvVar34;
  ulong uVar35;
  ulong uVar36;
  size_t sStack_180;
  undefined2 *local_170;
  undefined2 *local_168;
  BIT_DStream_t local_108;
  BIT_DStream_t local_e0;
  BIT_DStream_t local_b8;
  BIT_DStream_t local_90;
  undefined2 *local_68;
  size_t local_60;
  undefined2 *local_58;
  size_t local_50;
  size_t local_48;
  ulong local_40;
  undefined1 *local_38;
  
  if (cSrcSize < 10) {
    sStack_180 = 0xffffffffffffffec;
  }
  else {
    uVar17 = (ulong)*cSrc;
    uVar20 = (ulong)*(ushort *)((long)cSrc + 2);
    uVar36 = (ulong)*(ushort *)((long)cSrc + 4);
    uVar26 = uVar36 + 6 + uVar17 + uVar20;
    sStack_180 = 0xffffffffffffffec;
    if (uVar26 <= cSrcSize) {
      uVar7 = *(undefined2 *)((long)DTable + 2);
      local_60 = dstSize;
      sStack_180 = BIT_initDStream(&local_108,(void *)((long)cSrc + 6),uVar17);
      if (sStack_180 < 0xffffffffffffff89) {
        pvVar34 = (void *)((long)cSrc + uVar17 + 6);
        sStack_180 = BIT_initDStream(&local_90,pvVar34,uVar20);
        if (sStack_180 < 0xffffffffffffff89) {
          pvVar34 = (void *)((long)pvVar34 + uVar20);
          sStack_180 = BIT_initDStream(&local_b8,pvVar34,uVar36);
          if ((sStack_180 < 0xffffffffffffff89) &&
             (sStack_180 = BIT_initDStream(&local_e0,(void *)((long)pvVar34 + uVar36),
                                           cSrcSize - uVar26), sStack_180 < 0xffffffffffffff89)) {
            puVar1 = (undefined2 *)((long)dst + local_60);
            uVar26 = local_60 + 3 >> 2;
            puVar2 = (undefined2 *)((long)dst + uVar26);
            puVar3 = (undefined2 *)(uVar26 + (long)puVar2);
            BVar13 = BIT_reloadDStream(&local_108);
            BVar14 = BIT_reloadDStream(&local_90);
            BVar15 = BIT_reloadDStream(&local_b8);
            BVar16 = BIT_reloadDStream(&local_e0);
            BVar13 = BVar16 | BVar15 | BVar14 | BVar13;
            local_58 = (undefined2 *)((long)puVar1 + -7);
            bVar9 = -(char)uVar7;
            puVar27 = (undefined2 *)(uVar26 + (long)puVar3);
            puVar33 = puVar2;
            local_170 = (undefined2 *)dst;
            local_168 = puVar3;
            local_68 = puVar1;
            for (puVar29 = puVar27; (BVar13 == BIT_DStream_unfinished && (puVar29 < local_58));
                puVar29 = (undefined2 *)((long)puVar29 + (ulong)bVar4 + uVar31 + lVar12)) {
              uVar26 = (local_108.bitContainer << ((byte)local_108.bitsConsumed & 0x3f)) >>
                       (bVar9 & 0x3f);
              *local_170 = (short)DTable[uVar26 + 1];
              iVar23 = *(byte *)((long)DTable + uVar26 * 4 + 6) + local_108.bitsConsumed;
              uVar26 = (ulong)*(byte *)((long)DTable + uVar26 * 4 + 7);
              local_50 = local_90.bitContainer;
              uVar17 = (local_90.bitContainer << ((byte)local_90.bitsConsumed & 0x3f)) >>
                       (bVar9 & 0x3f);
              *puVar33 = (short)DTable[uVar17 + 1];
              local_48 = local_b8.bitContainer;
              uVar20 = (local_b8.bitContainer << ((byte)local_b8.bitsConsumed & 0x3f)) >>
                       (bVar9 & 0x3f);
              bVar4 = *(byte *)((long)DTable + uVar17 * 4 + 6);
              uVar17 = (ulong)*(byte *)((long)DTable + uVar17 * 4 + 7);
              *local_168 = (short)DTable[uVar20 + 1];
              uVar31 = (local_e0.bitContainer << ((byte)local_e0.bitsConsumed & 0x3f)) >>
                       (bVar9 & 0x3f);
              bVar5 = *(byte *)((long)DTable + uVar20 * 4 + 6);
              uVar36 = (ulong)*(byte *)((long)DTable + uVar20 * 4 + 7);
              *puVar29 = (short)DTable[uVar31 + 1];
              uVar20 = (local_108.bitContainer << ((byte)iVar23 & 0x3f)) >> (bVar9 & 0x3f);
              bVar6 = *(byte *)((long)DTable + uVar31 * 4 + 6);
              uVar32 = (ulong)*(byte *)((long)DTable + uVar31 * 4 + 7);
              *(short *)((long)local_170 + uVar26) = (short)DTable[uVar20 + 1];
              local_38 = (undefined1 *)((long)local_170 + uVar26);
              iVar25 = bVar4 + local_90.bitsConsumed;
              uVar26 = (local_90.bitContainer << ((byte)iVar25 & 0x3f)) >> (bVar9 & 0x3f);
              bVar4 = *(byte *)((long)DTable + uVar20 * 4 + 6);
              local_40 = (ulong)*(byte *)((long)DTable + uVar20 * 4 + 7);
              *(short *)((long)puVar33 + uVar17) = (short)DTable[uVar26 + 1];
              iVar18 = bVar5 + local_b8.bitsConsumed;
              bVar5 = *(byte *)((long)DTable + uVar26 * 4 + 6);
              uVar26 = (ulong)*(byte *)((long)DTable + uVar26 * 4 + 7);
              uVar20 = (local_b8.bitContainer << ((byte)iVar18 & 0x3f)) >> (bVar9 & 0x3f);
              *(short *)((long)local_168 + uVar36) = (short)DTable[uVar20 + 1];
              iVar24 = bVar6 + local_e0.bitsConsumed;
              bVar6 = *(byte *)((long)DTable + uVar20 * 4 + 6);
              uVar35 = (ulong)*(byte *)((long)DTable + uVar20 * 4 + 7);
              uVar20 = (local_e0.bitContainer << ((byte)iVar24 & 0x3f)) >> (bVar9 & 0x3f);
              *(short *)((long)puVar29 + uVar32) = (short)DTable[uVar20 + 1];
              iVar23 = (uint)bVar4 + iVar23;
              iVar25 = (uint)bVar5 + iVar25;
              bVar4 = *(byte *)((long)DTable + uVar20 * 4 + 6);
              uVar31 = (ulong)*(byte *)((long)DTable + uVar20 * 4 + 7);
              uVar20 = (local_108.bitContainer << ((byte)iVar23 & 0x3f)) >> (bVar9 & 0x3f);
              *(short *)(local_38 + local_40) = (short)DTable[uVar20 + 1];
              bVar5 = *(byte *)((long)DTable + uVar20 * 4 + 6);
              uVar20 = (ulong)*(byte *)((long)DTable + uVar20 * 4 + 7);
              uVar28 = (local_90.bitContainer << ((byte)iVar25 & 0x3f)) >> (bVar9 & 0x3f);
              *(short *)((long)puVar33 + uVar26 + uVar17) = (short)DTable[uVar28 + 1];
              lVar10 = uVar26 + uVar17;
              iVar18 = (uint)bVar6 + iVar18;
              bVar6 = *(byte *)((long)DTable + uVar28 * 4 + 6);
              uVar26 = (ulong)*(byte *)((long)DTable + uVar28 * 4 + 7);
              uVar17 = (local_b8.bitContainer << ((byte)iVar18 & 0x3f)) >> (bVar9 & 0x3f);
              *(short *)((long)local_168 + uVar35 + uVar36) = (short)DTable[uVar17 + 1];
              lVar11 = uVar35 + uVar36;
              iVar24 = (uint)bVar4 + iVar24;
              uVar36 = (local_e0.bitContainer << ((byte)iVar24 & 0x3f)) >> (bVar9 & 0x3f);
              bVar4 = *(byte *)((long)DTable + uVar17 * 4 + 6);
              uVar28 = (ulong)*(byte *)((long)DTable + uVar17 * 4 + 7);
              *(short *)((long)puVar29 + uVar31 + uVar32) = (short)DTable[uVar36 + 1];
              lVar12 = uVar31 + uVar32;
              iVar23 = (uint)bVar5 + iVar23;
              uVar17 = (local_108.bitContainer << ((byte)iVar23 & 0x3f)) >> (bVar9 & 0x3f);
              bVar5 = *(byte *)((long)DTable + uVar36 * 4 + 6);
              uVar31 = (ulong)*(byte *)((long)DTable + uVar36 * 4 + 7);
              *(short *)(local_38 + uVar20 + local_40) = (short)DTable[uVar17 + 1];
              iVar25 = (uint)bVar6 + iVar25;
              local_108.bitsConsumed = (uint)*(byte *)((long)DTable + uVar17 * 4 + 6) + iVar23;
              uVar36 = (local_90.bitContainer << ((byte)iVar25 & 0x3f)) >> (bVar9 & 0x3f);
              bVar6 = *(byte *)((long)DTable + uVar17 * 4 + 7);
              *(short *)((long)puVar33 + uVar26 + lVar10) = (short)DTable[uVar36 + 1];
              iVar18 = (uint)bVar4 + iVar18;
              local_90.bitsConsumed = (uint)*(byte *)((long)DTable + uVar36 * 4 + 6) + iVar25;
              uVar17 = (local_b8.bitContainer << ((byte)iVar18 & 0x3f)) >> (bVar9 & 0x3f);
              bVar4 = *(byte *)((long)DTable + uVar36 * 4 + 7);
              *(short *)((long)local_168 + uVar28 + lVar11) = (short)DTable[uVar17 + 1];
              iVar24 = (uint)bVar5 + iVar24;
              local_b8.bitsConsumed = (uint)*(byte *)((long)DTable + uVar17 * 4 + 6) + iVar18;
              uVar36 = (local_e0.bitContainer << ((byte)iVar24 & 0x3f)) >> (bVar9 & 0x3f);
              bVar5 = *(byte *)((long)DTable + uVar17 * 4 + 7);
              *(short *)((long)puVar29 + uVar31 + lVar12) = (short)DTable[uVar36 + 1];
              local_170 = (undefined2 *)(local_38 + (ulong)bVar6 + uVar20 + local_40);
              puVar33 = (undefined2 *)((long)puVar33 + (ulong)bVar4 + uVar26 + lVar10);
              local_168 = (undefined2 *)((long)local_168 + (ulong)bVar5 + uVar28 + lVar11);
              local_e0.bitsConsumed = (uint)*(byte *)((long)DTable + uVar36 * 4 + 6) + iVar24;
              bVar4 = *(byte *)((long)DTable + uVar36 * 4 + 7);
              BVar13 = BIT_reloadDStream(&local_108);
              BVar14 = BIT_reloadDStream(&local_90);
              BVar15 = BIT_reloadDStream(&local_b8);
              BVar16 = BIT_reloadDStream(&local_e0);
              BVar13 = BVar16 | BVar15 | BVar14 | BVar13;
            }
            if (puVar2 < local_170) {
              sStack_180 = 0xffffffffffffffec;
            }
            else {
              sStack_180 = 0xffffffffffffffec;
              if ((puVar33 <= puVar3) && (sStack_180 = 0xffffffffffffffec, local_168 <= puVar27)) {
                while ((BVar13 = BIT_reloadDStream(&local_108),
                       local_170 < (undefined2 *)((long)puVar2 - 7U) &&
                       (BVar13 == BIT_DStream_unfinished))) {
                  uVar26 = (local_108.bitContainer << ((byte)local_108.bitsConsumed & 0x3f)) >>
                           (bVar9 & 0x3f);
                  *local_170 = (short)DTable[uVar26 + 1];
                  iVar23 = *(byte *)((long)DTable + uVar26 * 4 + 6) + local_108.bitsConsumed;
                  uVar26 = (ulong)*(byte *)((long)DTable + uVar26 * 4 + 7);
                  uVar17 = (local_108.bitContainer << ((byte)iVar23 & 0x3f)) >> (bVar9 & 0x3f);
                  *(short *)((long)local_170 + uVar26) = (short)DTable[uVar17 + 1];
                  iVar23 = (uint)*(byte *)((long)DTable + uVar17 * 4 + 6) + iVar23;
                  uVar17 = (ulong)*(byte *)((long)DTable + uVar17 * 4 + 7);
                  lVar10 = uVar17 + uVar26;
                  uVar20 = (local_108.bitContainer << ((byte)iVar23 & 0x3f)) >> (bVar9 & 0x3f);
                  *(short *)((long)local_170 + uVar17 + uVar26) = (short)DTable[uVar20 + 1];
                  iVar23 = (uint)*(byte *)((long)DTable + uVar20 * 4 + 6) + iVar23;
                  uVar26 = (ulong)*(byte *)((long)DTable + uVar20 * 4 + 7);
                  uVar17 = (local_108.bitContainer << ((byte)iVar23 & 0x3f)) >> (bVar9 & 0x3f);
                  *(short *)((long)local_170 + uVar26 + lVar10) = (short)DTable[uVar17 + 1];
                  local_108.bitsConsumed = (uint)*(byte *)((long)DTable + uVar17 * 4 + 6) + iVar23;
                  local_170 = (undefined2 *)
                              ((long)local_170 +
                              (ulong)*(byte *)((long)DTable + uVar17 * 4 + 7) + uVar26 + lVar10);
                }
                while ((BVar13 = BIT_reloadDStream(&local_108), local_170 <= puVar2 + -1 &&
                       (BVar13 == BIT_DStream_unfinished))) {
                  uVar26 = (local_108.bitContainer << ((byte)local_108.bitsConsumed & 0x3f)) >>
                           (bVar9 & 0x3f);
                  *local_170 = (short)DTable[uVar26 + 1];
                  local_108.bitsConsumed =
                       *(byte *)((long)DTable + uVar26 * 4 + 6) + local_108.bitsConsumed;
                  local_170 = (undefined2 *)
                              ((long)local_170 + (ulong)*(byte *)((long)DTable + uVar26 * 4 + 7));
                }
                for (; local_170 <= puVar2 + -1;
                    local_170 = (undefined2 *)
                                ((long)local_170 + (ulong)*(byte *)((long)DTable + uVar26 * 4 + 7)))
                {
                  uVar26 = (local_108.bitContainer << ((byte)local_108.bitsConsumed & 0x3f)) >>
                           (bVar9 & 0x3f);
                  *local_170 = (short)DTable[uVar26 + 1];
                  local_108.bitsConsumed =
                       local_108.bitsConsumed + *(byte *)((long)DTable + uVar26 * 4 + 6);
                }
                uVar22 = local_108.bitsConsumed;
                if (local_170 < puVar2) {
                  uVar26 = (local_108.bitContainer << ((byte)local_108.bitsConsumed & 0x3f)) >>
                           (bVar9 & 0x3f);
                  *(char *)local_170 = (char)DTable[uVar26 + 1];
                  if (*(char *)((long)DTable + uVar26 * 4 + 7) == '\x01') {
                    uVar22 = local_108.bitsConsumed + *(byte *)((long)DTable + uVar26 * 4 + 6);
                  }
                  else if ((local_108.bitsConsumed < 0x40) &&
                          (uVar22 = local_108.bitsConsumed +
                                    *(byte *)((long)DTable + uVar26 * 4 + 6), 0x3f < uVar22)) {
                    uVar22 = 0x40;
                  }
                }
                local_108.bitsConsumed = uVar22;
                while ((BVar13 = BIT_reloadDStream(&local_90),
                       puVar33 < (undefined2 *)((long)puVar3 - 7U) &&
                       (BVar13 == BIT_DStream_unfinished))) {
                  uVar26 = (local_90.bitContainer << ((byte)local_90.bitsConsumed & 0x3f)) >>
                           (bVar9 & 0x3f);
                  *puVar33 = (short)DTable[uVar26 + 1];
                  iVar23 = *(byte *)((long)DTable + uVar26 * 4 + 6) + local_90.bitsConsumed;
                  uVar26 = (ulong)*(byte *)((long)DTable + uVar26 * 4 + 7);
                  uVar17 = (local_90.bitContainer << ((byte)iVar23 & 0x3f)) >> (bVar9 & 0x3f);
                  *(short *)((long)puVar33 + uVar26) = (short)DTable[uVar17 + 1];
                  iVar23 = (uint)*(byte *)((long)DTable + uVar17 * 4 + 6) + iVar23;
                  uVar17 = (ulong)*(byte *)((long)DTable + uVar17 * 4 + 7);
                  lVar10 = uVar17 + uVar26;
                  uVar20 = (local_90.bitContainer << ((byte)iVar23 & 0x3f)) >> (bVar9 & 0x3f);
                  *(short *)((long)puVar33 + uVar17 + uVar26) = (short)DTable[uVar20 + 1];
                  iVar23 = (uint)*(byte *)((long)DTable + uVar20 * 4 + 6) + iVar23;
                  uVar26 = (ulong)*(byte *)((long)DTable + uVar20 * 4 + 7);
                  uVar17 = (local_90.bitContainer << ((byte)iVar23 & 0x3f)) >> (bVar9 & 0x3f);
                  *(short *)((long)puVar33 + uVar26 + lVar10) = (short)DTable[uVar17 + 1];
                  local_90.bitsConsumed = (uint)*(byte *)((long)DTable + uVar17 * 4 + 6) + iVar23;
                  puVar33 = (undefined2 *)
                            ((long)puVar33 +
                            (ulong)*(byte *)((long)DTable + uVar17 * 4 + 7) + uVar26 + lVar10);
                }
                while ((BVar13 = BIT_reloadDStream(&local_90), uVar30 = local_90.bitsConsumed,
                       puVar33 <= puVar3 + -1 && (BVar13 == BIT_DStream_unfinished))) {
                  uVar26 = (local_90.bitContainer << ((byte)local_90.bitsConsumed & 0x3f)) >>
                           (bVar9 & 0x3f);
                  *puVar33 = (short)DTable[uVar26 + 1];
                  local_90.bitsConsumed =
                       *(byte *)((long)DTable + uVar26 * 4 + 6) + local_90.bitsConsumed;
                  puVar33 = (undefined2 *)
                            ((long)puVar33 + (ulong)*(byte *)((long)DTable + uVar26 * 4 + 7));
                }
                for (; puVar33 <= puVar3 + -1;
                    puVar33 = (undefined2 *)
                              ((long)puVar33 + (ulong)*(byte *)((long)DTable + uVar26 * 4 + 7))) {
                  uVar26 = (local_90.bitContainer << ((byte)uVar30 & 0x3f)) >> (bVar9 & 0x3f);
                  *puVar33 = (short)DTable[uVar26 + 1];
                  uVar30 = uVar30 + *(byte *)((long)DTable + uVar26 * 4 + 6);
                }
                if (puVar33 < puVar3) {
                  uVar26 = (local_90.bitContainer << ((byte)uVar30 & 0x3f)) >> (bVar9 & 0x3f);
                  *(char *)puVar33 = (char)DTable[uVar26 + 1];
                  if (*(char *)((long)DTable + uVar26 * 4 + 7) == '\x01') {
                    uVar30 = uVar30 + *(byte *)((long)DTable + uVar26 * 4 + 6);
                  }
                  else if (uVar30 < 0x40) {
                    uVar30 = uVar30 + *(byte *)((long)DTable + uVar26 * 4 + 6);
                    if (0x3f < uVar30) {
                      uVar30 = 0x40;
                    }
                  }
                }
                while ((BVar13 = BIT_reloadDStream(&local_b8),
                       local_168 < (undefined2 *)((long)puVar27 - 7U) &&
                       (BVar13 == BIT_DStream_unfinished))) {
                  uVar26 = (local_b8.bitContainer << ((byte)local_b8.bitsConsumed & 0x3f)) >>
                           (bVar9 & 0x3f);
                  *local_168 = (short)DTable[uVar26 + 1];
                  iVar23 = *(byte *)((long)DTable + uVar26 * 4 + 6) + local_b8.bitsConsumed;
                  uVar26 = (ulong)*(byte *)((long)DTable + uVar26 * 4 + 7);
                  uVar17 = (local_b8.bitContainer << ((byte)iVar23 & 0x3f)) >> (bVar9 & 0x3f);
                  *(short *)((long)local_168 + uVar26) = (short)DTable[uVar17 + 1];
                  iVar23 = (uint)*(byte *)((long)DTable + uVar17 * 4 + 6) + iVar23;
                  uVar17 = (ulong)*(byte *)((long)DTable + uVar17 * 4 + 7);
                  lVar10 = uVar17 + uVar26;
                  uVar20 = (local_b8.bitContainer << ((byte)iVar23 & 0x3f)) >> (bVar9 & 0x3f);
                  *(short *)((long)local_168 + uVar17 + uVar26) = (short)DTable[uVar20 + 1];
                  iVar23 = (uint)*(byte *)((long)DTable + uVar20 * 4 + 6) + iVar23;
                  uVar26 = (ulong)*(byte *)((long)DTable + uVar20 * 4 + 7);
                  uVar17 = (local_b8.bitContainer << ((byte)iVar23 & 0x3f)) >> (bVar9 & 0x3f);
                  *(short *)((long)local_168 + uVar26 + lVar10) = (short)DTable[uVar17 + 1];
                  local_b8.bitsConsumed = (uint)*(byte *)((long)DTable + uVar17 * 4 + 6) + iVar23;
                  local_168 = (undefined2 *)
                              ((long)local_168 +
                              (ulong)*(byte *)((long)DTable + uVar17 * 4 + 7) + uVar26 + lVar10);
                }
                while ((BVar13 = BIT_reloadDStream(&local_b8), uVar21 = local_b8.bitsConsumed,
                       local_168 <= puVar27 + -1 && (BVar13 == BIT_DStream_unfinished))) {
                  uVar26 = (local_b8.bitContainer << ((byte)local_b8.bitsConsumed & 0x3f)) >>
                           (bVar9 & 0x3f);
                  *local_168 = (short)DTable[uVar26 + 1];
                  local_b8.bitsConsumed =
                       *(byte *)((long)DTable + uVar26 * 4 + 6) + local_b8.bitsConsumed;
                  local_168 = (undefined2 *)
                              ((long)local_168 + (ulong)*(byte *)((long)DTable + uVar26 * 4 + 7));
                }
                for (; local_168 <= puVar27 + -1;
                    local_168 = (undefined2 *)
                                ((long)local_168 + (ulong)*(byte *)((long)DTable + uVar26 * 4 + 7)))
                {
                  uVar26 = (local_b8.bitContainer << ((byte)uVar21 & 0x3f)) >> (bVar9 & 0x3f);
                  *local_168 = (short)DTable[uVar26 + 1];
                  uVar21 = uVar21 + *(byte *)((long)DTable + uVar26 * 4 + 6);
                }
                if (local_168 < puVar27) {
                  uVar26 = (local_b8.bitContainer << ((byte)uVar21 & 0x3f)) >> (bVar9 & 0x3f);
                  *(char *)local_168 = (char)DTable[uVar26 + 1];
                  if (*(char *)((long)DTable + uVar26 * 4 + 7) == '\x01') {
                    uVar21 = uVar21 + *(byte *)((long)DTable + uVar26 * 4 + 6);
                  }
                  else if (uVar21 < 0x40) {
                    uVar21 = uVar21 + *(byte *)((long)DTable + uVar26 * 4 + 6);
                    if (0x3f < uVar21) {
                      uVar21 = 0x40;
                    }
                  }
                }
                while ((BVar13 = BIT_reloadDStream(&local_e0), puVar29 < local_58 &&
                       (BVar13 == BIT_DStream_unfinished))) {
                  uVar26 = (local_e0.bitContainer << ((byte)local_e0.bitsConsumed & 0x3f)) >>
                           (bVar9 & 0x3f);
                  *puVar29 = (short)DTable[uVar26 + 1];
                  iVar23 = *(byte *)((long)DTable + uVar26 * 4 + 6) + local_e0.bitsConsumed;
                  uVar26 = (ulong)*(byte *)((long)DTable + uVar26 * 4 + 7);
                  uVar17 = (local_e0.bitContainer << ((byte)iVar23 & 0x3f)) >> (bVar9 & 0x3f);
                  *(short *)((long)puVar29 + uVar26) = (short)DTable[uVar17 + 1];
                  iVar23 = (uint)*(byte *)((long)DTable + uVar17 * 4 + 6) + iVar23;
                  uVar17 = (ulong)*(byte *)((long)DTable + uVar17 * 4 + 7);
                  lVar10 = uVar17 + uVar26;
                  uVar20 = (local_e0.bitContainer << ((byte)iVar23 & 0x3f)) >> (bVar9 & 0x3f);
                  *(short *)((long)puVar29 + uVar17 + uVar26) = (short)DTable[uVar20 + 1];
                  iVar23 = (uint)*(byte *)((long)DTable + uVar20 * 4 + 6) + iVar23;
                  uVar26 = (ulong)*(byte *)((long)DTable + uVar20 * 4 + 7);
                  uVar17 = (local_e0.bitContainer << ((byte)iVar23 & 0x3f)) >> (bVar9 & 0x3f);
                  *(short *)((long)puVar29 + uVar26 + lVar10) = (short)DTable[uVar17 + 1];
                  local_e0.bitsConsumed = (uint)*(byte *)((long)DTable + uVar17 * 4 + 6) + iVar23;
                  puVar29 = (undefined2 *)
                            ((long)puVar29 +
                            (ulong)*(byte *)((long)DTable + uVar17 * 4 + 7) + uVar26 + lVar10);
                }
                puVar1 = local_68 + -1;
                while ((BVar13 = BIT_reloadDStream(&local_e0), puVar29 <= puVar1 &&
                       (BVar13 == BIT_DStream_unfinished))) {
                  uVar26 = (local_e0.bitContainer << ((byte)local_e0.bitsConsumed & 0x3f)) >>
                           (bVar9 & 0x3f);
                  *puVar29 = (short)DTable[uVar26 + 1];
                  local_e0.bitsConsumed =
                       *(byte *)((long)DTable + uVar26 * 4 + 6) + local_e0.bitsConsumed;
                  puVar29 = (undefined2 *)
                            ((long)puVar29 + (ulong)*(byte *)((long)DTable + uVar26 * 4 + 7));
                }
                for (; puVar29 <= puVar1;
                    puVar29 = (undefined2 *)
                              ((long)puVar29 + (ulong)*(byte *)((long)DTable + uVar26 * 4 + 7))) {
                  uVar26 = (local_e0.bitContainer << ((byte)local_e0.bitsConsumed & 0x3f)) >>
                           (bVar9 & 0x3f);
                  *puVar29 = (short)DTable[uVar26 + 1];
                  local_e0.bitsConsumed =
                       local_e0.bitsConsumed + *(byte *)((long)DTable + uVar26 * 4 + 6);
                }
                if (puVar29 < local_68) {
                  uVar26 = (local_e0.bitContainer << ((byte)local_e0.bitsConsumed & 0x3f)) >>
                           (bVar9 & 0x3f);
                  *(char *)puVar29 = (char)DTable[uVar26 + 1];
                  if (*(char *)((long)DTable + uVar26 * 4 + 7) == '\x01') {
                    local_e0.bitsConsumed =
                         local_e0.bitsConsumed + *(byte *)((long)DTable + uVar26 * 4 + 6);
                  }
                  else if (local_e0.bitsConsumed < 0x40) {
                    uVar19 = local_e0.bitsConsumed + *(byte *)((long)DTable + uVar26 * 4 + 6);
                    local_e0.bitsConsumed = 0x40;
                    if (uVar19 < 0x40) {
                      local_e0.bitsConsumed = uVar19;
                    }
                  }
                }
                sVar8 = 0xffffffffffffffec;
                if (local_e0.bitsConsumed != 0x40) {
                  local_60 = sVar8;
                }
                if (local_e0.ptr != local_e0.start) {
                  local_60 = sVar8;
                }
                if (uVar21 != 0x40) {
                  local_60 = sVar8;
                }
                if (local_b8.ptr != local_b8.start) {
                  local_60 = sVar8;
                }
                if (uVar30 != 0x40) {
                  local_60 = sVar8;
                }
                if (local_90.ptr != local_90.start) {
                  local_60 = sVar8;
                }
                if (uVar22 != 0x40) {
                  local_60 = sVar8;
                }
                sStack_180 = local_60;
                if (local_108.ptr != local_108.start) {
                  sStack_180 = sVar8;
                }
              }
            }
          }
        }
      }
    }
  }
  return sStack_180;
}

Assistant:

FORCE_INLINE_TEMPLATE size_t
HUF_decompress4X2_usingDTable_internal_body(
          void* dst,  size_t dstSize,
    const void* cSrc, size_t cSrcSize,
    const HUF_DTable* DTable)
{
    if (cSrcSize < 10) return ERROR(corruption_detected);   /* strict minimum : jump table + 1 byte per stream */

    {   const BYTE* const istart = (const BYTE*) cSrc;
        BYTE* const ostart = (BYTE*) dst;
        BYTE* const oend = ostart + dstSize;
        const void* const dtPtr = DTable+1;
        const HUF_DEltX2* const dt = (const HUF_DEltX2*)dtPtr;

        /* Init */
        BIT_DStream_t bitD1;
        BIT_DStream_t bitD2;
        BIT_DStream_t bitD3;
        BIT_DStream_t bitD4;
        size_t const length1 = MEM_readLE16(istart);
        size_t const length2 = MEM_readLE16(istart+2);
        size_t const length3 = MEM_readLE16(istart+4);
        size_t const length4 = cSrcSize - (length1 + length2 + length3 + 6);
        const BYTE* const istart1 = istart + 6;  /* jumpTable */
        const BYTE* const istart2 = istart1 + length1;
        const BYTE* const istart3 = istart2 + length2;
        const BYTE* const istart4 = istart3 + length3;
        size_t const segmentSize = (dstSize+3) / 4;
        BYTE* const opStart2 = ostart + segmentSize;
        BYTE* const opStart3 = opStart2 + segmentSize;
        BYTE* const opStart4 = opStart3 + segmentSize;
        BYTE* op1 = ostart;
        BYTE* op2 = opStart2;
        BYTE* op3 = opStart3;
        BYTE* op4 = opStart4;
        U32 endSignal;
        DTableDesc const dtd = HUF_getDTableDesc(DTable);
        U32 const dtLog = dtd.tableLog;

        if (length4 > cSrcSize) return ERROR(corruption_detected);   /* overflow */
        CHECK_F( BIT_initDStream(&bitD1, istart1, length1) );
        CHECK_F( BIT_initDStream(&bitD2, istart2, length2) );
        CHECK_F( BIT_initDStream(&bitD3, istart3, length3) );
        CHECK_F( BIT_initDStream(&bitD4, istart4, length4) );

        /* 16-32 symbols per loop (4-8 symbols per stream) */
        endSignal = BIT_reloadDStream(&bitD1) | BIT_reloadDStream(&bitD2) | BIT_reloadDStream(&bitD3) | BIT_reloadDStream(&bitD4);
        for ( ; (endSignal==BIT_DStream_unfinished) & (op4<(oend-(sizeof(bitD4.bitContainer)-1))) ; ) {
            HUF_DECODE_SYMBOLX2_2(op1, &bitD1);
            HUF_DECODE_SYMBOLX2_2(op2, &bitD2);
            HUF_DECODE_SYMBOLX2_2(op3, &bitD3);
            HUF_DECODE_SYMBOLX2_2(op4, &bitD4);
            HUF_DECODE_SYMBOLX2_1(op1, &bitD1);
            HUF_DECODE_SYMBOLX2_1(op2, &bitD2);
            HUF_DECODE_SYMBOLX2_1(op3, &bitD3);
            HUF_DECODE_SYMBOLX2_1(op4, &bitD4);
            HUF_DECODE_SYMBOLX2_2(op1, &bitD1);
            HUF_DECODE_SYMBOLX2_2(op2, &bitD2);
            HUF_DECODE_SYMBOLX2_2(op3, &bitD3);
            HUF_DECODE_SYMBOLX2_2(op4, &bitD4);
            HUF_DECODE_SYMBOLX2_0(op1, &bitD1);
            HUF_DECODE_SYMBOLX2_0(op2, &bitD2);
            HUF_DECODE_SYMBOLX2_0(op3, &bitD3);
            HUF_DECODE_SYMBOLX2_0(op4, &bitD4);

            endSignal = BIT_reloadDStream(&bitD1) | BIT_reloadDStream(&bitD2) | BIT_reloadDStream(&bitD3) | BIT_reloadDStream(&bitD4);
        }

        /* check corruption */
        if (op1 > opStart2) return ERROR(corruption_detected);
        if (op2 > opStart3) return ERROR(corruption_detected);
        if (op3 > opStart4) return ERROR(corruption_detected);
        /* note : op4 already verified within main loop */

        /* finish bitStreams one by one */
        HUF_decodeStreamX2(op1, &bitD1, opStart2, dt, dtLog);
        HUF_decodeStreamX2(op2, &bitD2, opStart3, dt, dtLog);
        HUF_decodeStreamX2(op3, &bitD3, opStart4, dt, dtLog);
        HUF_decodeStreamX2(op4, &bitD4, oend,     dt, dtLog);

        /* check */
        { U32 const endCheck = BIT_endOfDStream(&bitD1) & BIT_endOfDStream(&bitD2) & BIT_endOfDStream(&bitD3) & BIT_endOfDStream(&bitD4);
          if (!endCheck) return ERROR(corruption_detected); }

        /* decoded size */
        return dstSize;
    }
}